

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void page_unref(Page *pPage)

{
  int iVar1;
  Pager *pPager_00;
  Pager *pPager;
  int nRef;
  Page *pPage_local;
  
  if ((pPage->pPager->pAllocator->pMutexMethods != (SyMutexMethods *)0x0) &&
     (pPage->pPager->pAllocator->pMutex != (SyMutex *)0x0)) {
    (*pPage->pPager->pAllocator->pMutexMethods->xEnter)(pPage->pPager->pAllocator->pMutex);
  }
  iVar1 = pPage->nRef;
  pPage->nRef = iVar1 + -1;
  if ((pPage->pPager->pAllocator->pMutexMethods != (SyMutexMethods *)0x0) &&
     (pPage->pPager->pAllocator->pMutex != (SyMutex *)0x0)) {
    (*pPage->pPager->pAllocator->pMutexMethods->xLeave)(pPage->pPager->pAllocator->pMutex);
  }
  if (iVar1 == 0) {
    pPager_00 = pPage->pPager;
    if ((pPage->flags & 2U) == 0) {
      pager_unlink_page(pPager_00,pPage);
      pager_release_page(pPager_00,pPage);
    }
    else if (((pPage->flags & 0x80U) == 0) && ((pPage->flags & 0x40U) == 0)) {
      pPage->pPrevHot = (Page *)0x0;
      if (pPager_00->pFirstHot == (Page *)0x0) {
        pPager_00->pHotDirty = pPage;
        pPager_00->pFirstHot = pPage;
      }
      else {
        pPage->pNextHot = pPager_00->pHotDirty;
        if (pPager_00->pHotDirty != (Page *)0x0) {
          pPager_00->pHotDirty->pPrevHot = pPage;
        }
        pPager_00->pHotDirty = pPage;
      }
      pPager_00->nHot = pPager_00->nHot + 1;
      pPage->flags = pPage->flags | 0x40;
    }
  }
  return;
}

Assistant:

static void page_unref(Page *pPage)
{
	int nRef;
	if( pPage->pPager->pAllocator->pMutexMethods ){
		SyMutexEnter(pPage->pPager->pAllocator->pMutexMethods, pPage->pPager->pAllocator->pMutex);
	}
	nRef = pPage->nRef--;
	if( pPage->pPager->pAllocator->pMutexMethods ){
		SyMutexLeave(pPage->pPager->pAllocator->pMutexMethods, pPage->pPager->pAllocator->pMutex);
	}
	if( nRef == 0){
		Pager *pPager = pPage->pPager;
		if( !(pPage->flags & PAGE_DIRTY)  ){
			pager_unlink_page(pPager,pPage);
			/* Release the page */
			pager_release_page(pPager,pPage);
		}else{
			if( pPage->flags & PAGE_DONT_MAKE_HOT ){
				/* Do not add this page to the hot dirty list */
				return;
			}
			if( !(pPage->flags & PAGE_HOT_DIRTY) ){
				/* Add to the hot dirty list */
				pPage->pPrevHot = 0;
				if( pPager->pFirstHot == 0 ){
					pPager->pFirstHot = pPager->pHotDirty = pPage;
				}else{
					pPage->pNextHot = pPager->pHotDirty;
					if( pPager->pHotDirty ){
						pPager->pHotDirty->pPrevHot = pPage;
					}
					pPager->pHotDirty = pPage;
				}
				pPager->nHot++;
				pPage->flags |= PAGE_HOT_DIRTY;
			}
		}
	}
}